

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::BuiltinPrecisionTests::
TemplateFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::Normalize>::
~TemplateFuncCaseFactory
          (TemplateFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::Normalize> *this)

{
  TemplateFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::Normalize> *this_local;
  
  ~TemplateFuncCaseFactory(this);
  operator_delete(this,8);
  return;
}

Assistant:

MovePtr<TestNode>	createCase		(const Context& ctx) const
	{
		TestCaseGroup*	group = new TestCaseGroup(ctx.testContext,
							  ctx.name.c_str(), ctx.name.c_str());
		group->addChild(createFuncCase(ctx, "scalar", instance<GenF<1> >()));
		group->addChild(createFuncCase(ctx, "vec2", instance<GenF<2> >()));
		group->addChild(createFuncCase(ctx, "vec3", instance<GenF<3> >()));
		group->addChild(createFuncCase(ctx, "vec4", instance<GenF<4> >()));

		return MovePtr<TestNode>(group);
	}